

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_math.hpp
# Opt level: O3

double __thiscall
trng::int_math::power<2147461007,_889744251>::pow
          (power<2147461007,_889744251> *this,double __x,double __y)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  uint in_ESI;
  ulong uVar4;
  long lVar5;
  
  if (0 < (int)in_ESI) {
    lVar2 = 1;
    lVar3 = 0x35086b7b;
    do {
      if ((in_ESI & 1) != 0) {
        uVar4 = ((ulong)(lVar2 * lVar3) >> 0x1f) * -0x7fffa78f + lVar2 * lVar3;
        uVar4 = (uVar4 >> 0x1f) * -0x7fffa78f + uVar4;
        lVar5 = uVar4 << 0x20;
        lVar2 = lVar5 + -0x7fffa78f00000000;
        if (uVar4 < 0x7fffa78f) {
          lVar2 = lVar5;
        }
        lVar2 = lVar2 >> 0x20;
      }
      uVar4 = ((ulong)(lVar3 * lVar3) >> 0x1f) * -0x7fffa78f + lVar3 * lVar3;
      uVar4 = (uVar4 >> 0x1f) * -0x7fffa78f + uVar4;
      lVar5 = uVar4 << 0x20;
      lVar3 = lVar5 + -0x7fffa78f00000000;
      if (uVar4 < 0x7fffa78f) {
        lVar3 = lVar5;
      }
      lVar3 = lVar3 >> 0x20;
      bVar1 = 1 < in_ESI;
      in_ESI = in_ESI >> 1;
    } while (bVar1);
    return __x;
  }
  return __x;
}

Assistant:

int32_t pow(int32_t n) {
        int64_t p{1}, t{b};
        while (n > 0) {
          if ((n & 0x1) == 0x1)
            p = modulo<m, 1>(p * t);
          t = modulo<m, 1>(t * t);
          n /= 2;
        }
        return static_cast<int32_t>(p);
      }